

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O2

void __thiscall nesvis::Screen::draw(Screen *this,RenderWindow *window)

{
  Sprite sprite;
  
  sprite.super_Drawable._vptr_Drawable = (_func_int **)0x0;
  sprite.super_Transformable._vptr_Transformable = (_func_int **)0x0;
  sf::Texture::loadFromImage(&this->texture_,&this->image_,(IntRect *)&sprite);
  sf::Sprite::Sprite(&sprite);
  sf::Sprite::setTexture(&sprite,&this->texture_,true);
  sf::Transformable::setScale(&sprite.super_Transformable,this->scaling_,this->scaling_);
  sf::RenderTarget::draw
            (&window->super_RenderTarget,&sprite.super_Drawable,
             (RenderStates *)sf::RenderStates::Default);
  sf::Transformable::~Transformable(&sprite.super_Transformable);
  return;
}

Assistant:

void Screen::draw(sf::RenderWindow &window) {
    texture_.loadFromImage(image_);
    sf::Sprite sprite;
    sprite.setTexture(texture_, true);
    sprite.setScale(scaling_, scaling_);

    window.draw(sprite);
}